

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

Value * duckdb::NumericValueUnionToValueInternal
                  (Value *__return_storage_ptr__,LogicalType *type,NumericValueUnion *val)

{
  PhysicalType PVar1;
  InternalException *this;
  hugeint_t value;
  uhugeint_t value_00;
  string local_40;
  
  PVar1 = type->physical_type_;
  value.upper._0_4_ = PVar1 - 1;
  switch((int)value.upper) {
  case 0:
    Value::BOOLEAN(__return_storage_ptr__,(val->value_).boolean);
    break;
  case 1:
    Value::UTINYINT(__return_storage_ptr__,(val->value_).utinyint);
    break;
  case 2:
    Value::TINYINT(__return_storage_ptr__,(val->value_).tinyint);
    break;
  case 3:
    Value::USMALLINT(__return_storage_ptr__,(val->value_).usmallint);
    break;
  case 4:
    Value::SMALLINT(__return_storage_ptr__,(val->value_).smallint);
    break;
  case 5:
    Value::UINTEGER(__return_storage_ptr__,(val->value_).uinteger);
    break;
  case 6:
    Value::INTEGER(__return_storage_ptr__,(val->value_).integer);
    break;
  case 7:
    Value::UBIGINT(__return_storage_ptr__,(val->value_).ubigint);
    break;
  case 8:
    Value::BIGINT(__return_storage_ptr__,(val->value_).bigint);
    break;
  case 9:
switchD_005f26c4_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported type for NumericValueUnionToValue","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    Value::FLOAT(__return_storage_ptr__,(val->value_).float_);
    break;
  case 0xb:
    Value::DOUBLE(__return_storage_ptr__,(val->value_).double_);
    break;
  default:
    if (PVar1 == UINT128) {
      value_00.upper._0_4_ = (int)value.upper;
      value_00.lower = (val->value_).hugeint.upper;
      value_00.upper._4_4_ = 0;
      Value::UHUGEINT(__return_storage_ptr__,(Value *)(val->value_).bigint,value_00);
    }
    else {
      if (PVar1 != INT128) goto switchD_005f26c4_caseD_a;
      value.lower = (val->value_).hugeint.upper;
      value.upper._4_4_ = 0;
      Value::HUGEINT(__return_storage_ptr__,(Value *)(val->value_).bigint,value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value NumericValueUnionToValueInternal(const LogicalType &type, const NumericValueUnion &val) {
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		return Value::BOOLEAN(val.value_.boolean);
	case PhysicalType::INT8:
		return Value::TINYINT(val.value_.tinyint);
	case PhysicalType::INT16:
		return Value::SMALLINT(val.value_.smallint);
	case PhysicalType::INT32:
		return Value::INTEGER(val.value_.integer);
	case PhysicalType::INT64:
		return Value::BIGINT(val.value_.bigint);
	case PhysicalType::UINT8:
		return Value::UTINYINT(val.value_.utinyint);
	case PhysicalType::UINT16:
		return Value::USMALLINT(val.value_.usmallint);
	case PhysicalType::UINT32:
		return Value::UINTEGER(val.value_.uinteger);
	case PhysicalType::UINT64:
		return Value::UBIGINT(val.value_.ubigint);
	case PhysicalType::INT128:
		return Value::HUGEINT(val.value_.hugeint);
	case PhysicalType::UINT128:
		return Value::UHUGEINT(val.value_.uhugeint);
	case PhysicalType::FLOAT:
		return Value::FLOAT(val.value_.float_);
	case PhysicalType::DOUBLE:
		return Value::DOUBLE(val.value_.double_);
	default:
		throw InternalException("Unsupported type for NumericValueUnionToValue");
	}
}